

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplication::alert(QWidget *widget,int duration)

{
  long lVar1;
  bool bVar2;
  WindowStates WVar3;
  QWidget *pQVar4;
  QWindow *pQVar5;
  QWidgetList *__range2;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    topLevelWidgets();
    lVar6 = 0;
    do {
      alert(*(QWidget **)(&DAT_aaaaaaaaaaaaaaaa + lVar6),duration);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x5555555555555550);
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
    }
  }
  else {
    pQVar4 = QWidget::window(widget);
    bVar2 = QWidget::isActiveWindow(pQVar4);
    if (bVar2) {
      pQVar4 = QWidget::window(widget);
      WVar3 = QWidget::windowState(pQVar4);
      if (((uint)WVar3.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 1) == 0) goto LAB_002c0cd6;
    }
    pQVar5 = QApplicationPrivate::windowForWidget(widget);
    if (pQVar5 != (QWindow *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        QWindow::alert((int)pQVar5);
        return;
      }
      goto LAB_002c0cf2;
    }
  }
LAB_002c0cd6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_002c0cf2:
  __stack_chk_fail();
}

Assistant:

void QApplication::alert(QWidget *widget, int duration)
{
    if (widget) {
       if (widget->window()->isActiveWindow() && !(widget->window()->windowState() & Qt::WindowMinimized))
            return;
        if (QWindow *window= QApplicationPrivate::windowForWidget(widget))
            window->alert(duration);
    } else {
        const auto topLevels = topLevelWidgets();
        for (QWidget *topLevel : topLevels)
            QApplication::alert(topLevel, duration);
    }
}